

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O1

char * str_find_nocase(char *haystack,char *needle)

{
  char cVar1;
  char *in_RAX;
  __int32_t **pp_Var2;
  char cVar3;
  char *pcVar4;
  long lVar5;
  
  do {
    if (*haystack == '\0') {
      return (char *)0x0;
    }
    cVar3 = *haystack;
    pcVar4 = needle;
    if (cVar3 != '\0') {
      lVar5 = 0;
      do {
        cVar1 = needle[lVar5];
        if ((long)cVar1 == 0) break;
        pp_Var2 = __ctype_tolower_loc();
        if ((*pp_Var2)[cVar3] != (*pp_Var2)[cVar1]) goto LAB_001453dc;
        pcVar4 = pcVar4 + 1;
        cVar3 = haystack[lVar5 + 1];
        lVar5 = lVar5 + 1;
      } while (cVar3 != '\0');
      pcVar4 = needle + lVar5;
    }
LAB_001453dc:
    if (*pcVar4 == '\0') {
      in_RAX = haystack;
    }
    haystack = haystack + 1;
    if (*pcVar4 == '\0') {
      return in_RAX;
    }
  } while( true );
}

Assistant:

const char *str_find_nocase(const char *haystack, const char *needle)
{
	while(*haystack) /* native implementation */
	{
		const char *a = haystack;
		const char *b = needle;
		while(*a && *b && tolower(*a) == tolower(*b))
		{
			a++;
			b++;
		}
		if(!(*b))
			return haystack;
		haystack++;
	}

	return 0;
}